

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.hpp
# Opt level: O1

DescriptorSetAllocation * __thiscall
Diligent::DescriptorSetAllocation::operator=
          (DescriptorSetAllocation *this,DescriptorSetAllocation *rhs)

{
  Release(this);
  this->Set = rhs->Set;
  this->CmdQueueMask = rhs->CmdQueueMask;
  this->Pool = rhs->Pool;
  this->DescrSetAllocator = rhs->DescrSetAllocator;
  rhs->CmdQueueMask = 0;
  rhs->DescrSetAllocator = (DescriptorSetAllocator *)0x0;
  rhs->Set = (VkDescriptorSet)0x0;
  rhs->Pool = (VkDescriptorPool)0x0;
  return this;
}

Assistant:

DescriptorSetAllocation& operator=(DescriptorSetAllocation&& rhs) noexcept
    {
        Release();

        Set               = rhs.Set;
        CmdQueueMask      = rhs.CmdQueueMask;
        Pool              = rhs.Pool;
        DescrSetAllocator = rhs.DescrSetAllocator;

        rhs.Reset();

        return *this;
    }